

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* adios2::helper::AvailableIpAddresses_abi_cxx11_(void)

{
  bool bVar1;
  int __fd;
  int iVar2;
  if_nameindex *piVar3;
  char *pcVar4;
  int *piVar5;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  char **ppcVar6;
  bool bVar7;
  string ip;
  ifreq req;
  allocator local_85;
  uint local_84;
  if_nameindex *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char local_58 [20];
  in_addr local_44;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  __fd = socket(2,2,0);
  if (-1 < __fd) {
    piVar3 = if_nameindex();
    if (piVar3 != (if_nameindex *)0x0) {
      ppcVar6 = &piVar3->if_name;
      local_84 = 0;
      local_80 = piVar3;
      while( true ) {
        bVar7 = true;
        if (((if_nameindex *)(ppcVar6 + -1))->if_index == 0) {
          bVar7 = *ppcVar6 != (char *)0x0;
        }
        if (!bVar7) break;
        strncpy(local_58,*ppcVar6,0xf);
        iVar2 = ioctl(__fd,0x8915,local_58);
        if (iVar2 < 0) {
          piVar5 = __errno_location();
          bVar1 = false;
          if (*piVar5 != 99) {
            if_freenameindex(local_80);
            iVar2 = close(__fd);
            local_84 = (uint)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
            bVar1 = true;
          }
        }
        else {
          pcVar4 = inet_ntoa(local_44);
          std::__cxx11::string::string((string *)&local_78,pcVar4,&local_85);
          iVar2 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar2 != 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>(in_RDI,&local_78);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          bVar1 = false;
        }
        if (bVar1) break;
        ppcVar6 = ppcVar6 + 2;
      }
      if (bVar7) {
        if ((local_84 & 1) != 0) {
          return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI);
        return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI;
      }
      if_freenameindex(local_80);
    }
    close(__fd);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string>
AvailableIpAddresses() noexcept
{
    std::vector<std::string> ips;
    int socket_handler = -1;
    if ((socket_handler = socket(PF_INET, SOCK_DGRAM, 0)) < 0)
    {
        return ips;
    }
    struct if_nameindex *head = if_nameindex();
    if (!head)
    {
        close(socket_handler);
        return ips;
    }
    for (struct if_nameindex *p = head; !(p->if_index == 0 && p->if_name == NULL); ++p)
    {
        struct ifreq req;
        strncpy(req.ifr_name, p->if_name, IFNAMSIZ - 1);
        if (ioctl(socket_handler, SIOCGIFADDR, &req) < 0)
        {
            if (errno == EADDRNOTAVAIL)
            {
                continue;
            }
            if_freenameindex(head);
            close(socket_handler);
            return ips;
        }
        const std::string ip = inet_ntoa(((struct sockaddr_in *)&req.ifr_addr)->sin_addr);
        if (ip != "127.0.0.1")
        {
            ips.emplace_back(ip);
        }
    }
    if_freenameindex(head);
    close(socket_handler);
    return ips;
}